

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

bool duckdb::RLEAnalyze<signed_char>(AnalyzeState *state,Vector *input,idx_t count)

{
  ValidityMask *validity;
  ulong in_RDX;
  idx_t idx;
  idx_t i;
  char *data;
  UnifiedVectorFormat vdata;
  RLEAnalyzeState<signed_char> *rle_state;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  ulong idx_00;
  UnifiedVectorFormat *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  RLEState<signed_char> *in_stack_ffffffffffffff90;
  UnifiedVectorFormat local_68;
  RLEAnalyzeState<signed_char> *local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = AnalyzeState::Cast<duckdb::RLEAnalyzeState<signed_char>>
                       ((AnalyzeState *)in_stack_ffffffffffffff70);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff80);
  Vector::ToUnifiedFormat
            ((Vector *)vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
             (idx_t)vdata.data,(UnifiedVectorFormat *)vdata.sel);
  validity = (ValidityMask *)UnifiedVectorFormat::GetData<signed_char>(&local_68);
  for (idx_00 = 0; idx_00 < local_18; idx_00 = idx_00 + 1) {
    in_stack_ffffffffffffff70 =
         (UnifiedVectorFormat *)SelectionVector::get_index(local_68.sel,idx_00);
    RLEState<signed_char>::Update<duckdb::EmptyRLEWriter>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,validity,idx_00);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff70);
  return true;
}

Assistant:

bool RLEAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &rle_state = state.template Cast<RLEAnalyzeState<T>>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		rle_state.state.Update(data, vdata.validity, idx);
	}
	return true;
}